

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# java_helpers.cc
# Opt level: O0

JavaType google::protobuf::compiler::java::GetJavaType(FieldDescriptor *field)

{
  Type TVar1;
  undefined4 in_stack_ffffffffffffff88;
  int in_stack_ffffffffffffff8c;
  LogMessage *this;
  undefined8 in_stack_ffffffffffffff98;
  LogLevel level;
  LogMessage local_48;
  JavaType local_4;
  
  level = (LogLevel)((ulong)in_stack_ffffffffffffff98 >> 0x20);
  TVar1 = GetType((FieldDescriptor *)0x459d53);
  switch((LogMessage *)(ulong)(TVar1 - TYPE_DOUBLE)) {
  case (LogMessage *)0x0:
    local_4 = JAVATYPE_DOUBLE;
    break;
  case (LogMessage *)0x1:
    local_4 = JAVATYPE_FLOAT;
    break;
  case (LogMessage *)0x2:
  case (LogMessage *)0x3:
  case (LogMessage *)0x5:
  case (LogMessage *)0xf:
  case (LogMessage *)0x11:
    local_4 = JAVATYPE_LONG;
    break;
  case (LogMessage *)0x4:
  case (LogMessage *)0x6:
  case (LogMessage *)0xc:
  case (LogMessage *)0xe:
  case (LogMessage *)0x10:
    local_4 = JAVATYPE_INT;
    break;
  case (LogMessage *)0x7:
    local_4 = JAVATYPE_BOOLEAN;
    break;
  case (LogMessage *)0x8:
    local_4 = JAVATYPE_STRING;
    break;
  case (LogMessage *)0x9:
  case (LogMessage *)0xa:
    local_4 = JAVATYPE_MESSAGE;
    break;
  case (LogMessage *)0xb:
    local_4 = JAVATYPE_BYTES;
    break;
  case (LogMessage *)0xd:
    local_4 = JAVATYPE_ENUM;
    break;
  default:
    this = &local_48;
    internal::LogMessage::LogMessage
              ((LogMessage *)(ulong)(TVar1 - TYPE_DOUBLE),level,(char *)this,
               in_stack_ffffffffffffff8c);
    internal::LogMessage::operator<<
              (this,(char *)CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88));
    internal::LogFinisher::operator=
              ((LogFinisher *)this,
               (LogMessage *)CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88));
    internal::LogMessage::~LogMessage((LogMessage *)0x459e3f);
    local_4 = JAVATYPE_INT;
  }
  return local_4;
}

Assistant:

JavaType GetJavaType(const FieldDescriptor* field) {
  switch (GetType(field)) {
    case FieldDescriptor::TYPE_INT32:
    case FieldDescriptor::TYPE_UINT32:
    case FieldDescriptor::TYPE_SINT32:
    case FieldDescriptor::TYPE_FIXED32:
    case FieldDescriptor::TYPE_SFIXED32:
      return JAVATYPE_INT;

    case FieldDescriptor::TYPE_INT64:
    case FieldDescriptor::TYPE_UINT64:
    case FieldDescriptor::TYPE_SINT64:
    case FieldDescriptor::TYPE_FIXED64:
    case FieldDescriptor::TYPE_SFIXED64:
      return JAVATYPE_LONG;

    case FieldDescriptor::TYPE_FLOAT:
      return JAVATYPE_FLOAT;

    case FieldDescriptor::TYPE_DOUBLE:
      return JAVATYPE_DOUBLE;

    case FieldDescriptor::TYPE_BOOL:
      return JAVATYPE_BOOLEAN;

    case FieldDescriptor::TYPE_STRING:
      return JAVATYPE_STRING;

    case FieldDescriptor::TYPE_BYTES:
      return JAVATYPE_BYTES;

    case FieldDescriptor::TYPE_ENUM:
      return JAVATYPE_ENUM;

    case FieldDescriptor::TYPE_GROUP:
    case FieldDescriptor::TYPE_MESSAGE:
      return JAVATYPE_MESSAGE;

      // No default because we want the compiler to complain if any new
      // types are added.
  }

  GOOGLE_LOG(FATAL) << "Can't get here.";
  return JAVATYPE_INT;
}